

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::InFilter::CheckStatistics(InFilter *this,BaseStatistics *stats)

{
  PhysicalType PVar1;
  pointer pVVar2;
  pointer pVVar3;
  FilterPropagateResult FVar4;
  reference pvVar5;
  idx_t in_R8;
  array_ptr<duckdb::Value,_true> constants;
  array_ptr<duckdb::Value,_true> constants_00;
  
  pvVar5 = vector<duckdb::Value,_true>::get<true>(&this->values,0);
  PVar1 = (pvVar5->type_).physical_type_;
  if (((0xc < PVar1) || ((0x1bfcU >> (PVar1 & 0x1f) & 1) == 0)) && (1 < PVar1 - 0xcb)) {
    if (PVar1 == VARCHAR) {
      pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      pVVar3 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      array_ptr<duckdb::Value,_true>::AssertNotNull(pVVar2 == (pointer)0x0);
      constants_00.count = in_R8;
      constants_00.ptr = (Value *)((long)pVVar3 - (long)pVVar2 >> 6);
      FVar4 = StringStats::CheckZonemap
                        ((StringStats *)stats,(BaseStatistics *)0x19,(ExpressionType)pVVar2,
                         constants_00);
      return FVar4;
    }
    return NO_PRUNING_POSSIBLE;
  }
  pVVar2 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  array_ptr<duckdb::Value,_true>::AssertNotNull(pVVar2 == (pointer)0x0);
  constants.count = in_R8;
  constants.ptr = (Value *)((long)pVVar3 - (long)pVVar2 >> 6);
  FVar4 = NumericStats::CheckZonemap
                    ((NumericStats *)stats,(BaseStatistics *)0x19,(ExpressionType)pVVar2,constants);
  return FVar4;
}

Assistant:

FilterPropagateResult InFilter::CheckStatistics(BaseStatistics &stats) {
	switch (values[0].type().InternalType()) {
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return NumericStats::CheckZonemap(stats, ExpressionType::COMPARE_EQUAL,
		                                  array_ptr<Value>(values.data(), values.size()));
	case PhysicalType::VARCHAR:
		return StringStats::CheckZonemap(stats, ExpressionType::COMPARE_EQUAL,
		                                 array_ptr<Value>(values.data(), values.size()));
	default:
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
}